

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O0

void __thiscall
bpwriter::format_int(bpwriter *this,char *p,size_t len,char *type_prefix,fmtopts *opts,int flags)

{
  undefined1 auVar1 [16];
  bool bVar2;
  wchar_t ch;
  int iVar3;
  size_t sVar4;
  char *in_RCX;
  ulong in_RDX;
  char *in_RSI;
  bpwriter *in_RDI;
  char *in_R8;
  uint in_R9D;
  int dig;
  int i_1;
  int padcnt;
  int dispwid;
  int digits;
  size_t i;
  char *p2;
  int zero;
  int in_stack_ffffffffffffff98;
  int local_54;
  int local_50;
  int local_48;
  int local_44;
  ulong local_40;
  ulong local_18;
  char *local_10;
  
  if ((in_RSI == (char *)0x0) || (local_18 = in_RDX, local_10 = in_RSI, in_RDX == 0)) {
    local_10 = "0";
    local_18 = 1;
  }
  bVar2 = true;
  local_40 = 0;
  do {
    if (local_18 <= local_40) {
LAB_00300ba1:
      local_48 = (int)local_18;
      local_44 = local_48;
      if (*local_10 == '-') {
        local_44 = local_48 + -1;
      }
      if ((*in_R8 != '\0') && (*local_10 != '-')) {
        local_48 = local_48 + 1;
      }
      if (*(int *)(in_R8 + 4) != 0) {
        auVar1._8_8_ = 0;
        auVar1._0_8_ = (local_18 - (long)(int)(uint)(*local_10 == '-')) - 1;
        local_48 = local_48 + SUB164(auVar1 / ZEXT816(3),0);
      }
      if (((*(int *)(in_R8 + 0x18) != 0) && (in_RCX != (char *)0x0)) && (!bVar2)) {
        sVar4 = strlen(in_RCX);
        local_48 = local_48 + (int)sVar4;
      }
      if (local_44 < *(int *)(in_R8 + 0xc)) {
        local_48 = (*(int *)(in_R8 + 0xc) - local_44) + local_48;
      }
      if (local_48 < *(int *)(in_R8 + 8)) {
        ch = *(int *)(in_R8 + 8) - local_48;
      }
      else {
        ch = L'\0';
      }
      if (*(int *)(in_R8 + 0x10) == 0) {
        putwch(in_RDI,ch,in_stack_ffffffffffffff98);
      }
      if ((*in_R8 != '\0') && (*local_10 != '-')) {
        putch(in_RDI,(char)((uint)ch >> 0x18));
      }
      if (*local_10 == '-') {
        local_10 = local_10 + 1;
        putch(in_RDI,(char)((uint)ch >> 0x18));
        local_18 = local_18 - 1;
      }
      if (((*(int *)(in_R8 + 0x18) != 0) && (in_RCX != (char *)0x0)) && (!bVar2)) {
        puts(in_RDI,in_RCX);
      }
      for (local_50 = local_44; local_50 < *(int *)(in_R8 + 0xc); local_50 = local_50 + 1) {
        putch(in_RDI,(char)((uint)ch >> 0x18));
      }
      local_54 = 0;
      for (; local_18 != 0; local_18 = local_18 - 1) {
        if (((*(int *)(in_R8 + 4) != 0) && (local_54 != 0)) && (local_18 % 3 == 0)) {
          putwch(in_RDI,ch);
        }
        iVar3 = is_digit(L'\0');
        if (iVar3 == 0) {
          if ((in_R9D & 2) == 0) {
            tolower((int)*local_10);
            putch(in_RDI,(char)((uint)ch >> 0x18));
          }
          else {
            toupper((int)*local_10);
            putch(in_RDI,(char)((uint)ch >> 0x18));
          }
        }
        else {
          putch(in_RDI,(char)((uint)ch >> 0x18));
        }
        local_10 = local_10 + 1;
        local_54 = local_54 + 1;
      }
      if (*(int *)(in_R8 + 0x10) != 0) {
        putwch(in_RDI,ch,in_stack_ffffffffffffff98);
      }
      return;
    }
    if (*local_10 != '0') {
      bVar2 = false;
      goto LAB_00300ba1;
    }
    local_40 = local_40 + 1;
  } while( true );
}

Assistant:

void format_int(VMG_ const char *p, size_t len,
                    const char *type_prefix,
                    const fmtopts &opts, int flags)
    {
        /* if they're trying to pawn off an empty string on us, use "0" */
        if (p == 0 || len == 0)
            p = "0", len = 1;

        /* note if the value is all zeros */
        int zero = TRUE;
        const char *p2 = p;
        for (size_t i = 0 ; i < len ; ++i)
        {
            if (*p2 != '0')
            {
                zero = FALSE;
                break;
            }
        }

        /* 
         *   get the number of digits: assume that the whole thing is digits
         *   except for a leading minus sign 
         */
        int digits = len;
        if (*p == '-')
            --digits;

        /* 
         *   Figure the display width required.  Start with the length of the
         *   string.  If we the "sign" option is set and we don't have a "-"
         *   sign, add space for a "+" sign.  If the "group" option is set,
         *   add a comma for each group of three digits.  If the '#' flag is
         *   set, add the type prefix if the value is nonzero.  
         */
        int dispwid = len;
        if (opts.sign != '\0' && *p != '-')
            dispwid += 1;
        if (opts.group != 0)
            dispwid += ((len - (*p == '-' ? 1 : 0)) - 1)/3;
        if (opts.pound && type_prefix != 0 && !zero)
            dispwid += strlen(type_prefix);

        /*
         *   If there's a precision setting, it means that we're to add
         *   leading zeros to bring the number of digits up to the
         *   precision. 
         */
        if (digits < opts.prec)
            dispwid += opts.prec - digits;

        /* 
         *   Figure the amount of padding.  If there's an explicit width spec
         *   in the options, and the display width is less than the width
         *   spec, pad by the differene.  
         */
        int padcnt = (opts.width > dispwid ? opts.width - dispwid : 0);

        /* if they want right alignment, add padding characters before */
        if (!opts.left_align)
            putwch(opts.pad, padcnt);

        /* add the + sign if needed */
        if (opts.sign && *p != '-')
            putch(opts.sign);

        /* if there's a '-' sign, write it */
        if (*p == '-')
            putch(*p++), --len;

        /* add the type prefix */
        if (opts.pound && type_prefix != 0 && !zero)
            puts(type_prefix);

        /* add the leading zeros for the precision */
        for (int i = digits ; i < opts.prec ; ++i)
            putch('0');

        /* write the digits, adding grouping commas and converting case */
        for (int dig = 0 ; len != 0 ; ++p, --len, ++dig)
        {
            /* 
             *   if this isn't the first digit, and we have a multiple of
             *   three digits remaining, and we're using grouping, add the
             *   group comma 
             */
            if (opts.group != 0 && dig != 0 && len % 3 == 0)
                putwch(opts.group);

            /* write this character, converting case as needed */
            if (is_digit(*p))
                putch(*p);
            else if ((flags & FI_CAPS) != 0)
                putch((char)toupper(*p));
            else
                putch((char)tolower(*p));
        }

        /* if they want left alignment, add padding characters after */
        if (opts.left_align)
            putwch(opts.pad, padcnt);
    }